

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_item_query.c
# Opt level: O0

mpt_config_item * mpt_config_item_query(mpt_array *arr,mpt_path *path)

{
  char *pcVar1;
  size_t sVar2;
  mpt_type_traits *pmVar3;
  mpt_buffer *pmVar4;
  int nlen;
  int iVar5;
  mpt_type_traits *pmVar6;
  ulong uVar7;
  ulong uStack_40;
  int len;
  size_t item_count;
  char *name;
  mpt_config_item *item;
  mpt_buffer *buf;
  mpt_path *path_local;
  mpt_array *arr_local;
  
  pcVar1 = path->base;
  sVar2 = path->off;
  name = (char *)arr->_buf;
  if (((mpt_buffer *)name == (mpt_buffer *)0x0) || (nlen = mpt_path_next(path), nlen < 0)) {
    arr_local = (mpt_array *)0x0;
  }
  else {
    pmVar3 = ((mpt_buffer *)name)->_content_traits;
    pmVar6 = mpt_config_item_traits();
    if (pmVar3 == pmVar6) {
      uStack_40 = ((mpt_buffer *)name)->_size >> 5;
      do {
        pmVar4 = (mpt_buffer *)name;
        name = (char *)(pmVar4 + 1);
        uVar7 = uStack_40 - 1;
        if (uStack_40 == 0) {
          return (mpt_config_item *)0x0;
        }
        uStack_40 = uVar7;
      } while (((short)pmVar4[1]._size == 0) ||
              (iVar5 = mpt_identifier_compare
                                 ((mpt_identifier *)&pmVar4[1]._size,pcVar1 + sVar2,nlen),
              iVar5 != 0));
      if (path->len == 0) {
        arr_local = (mpt_array *)name;
      }
      else {
        arr_local = &mpt_config_item_query((mpt_array *)name,path)->elements;
      }
    }
    else {
      arr_local = (mpt_array *)0x0;
    }
  }
  return (mpt_config_item *)arr_local;
}

Assistant:

extern MPT_STRUCT(config_item) *mpt_config_item_query(const _MPT_UARRAY_TYPE(MPT_STRUCT(config_item)) *arr, MPT_STRUCT(path) *path)
{
	const MPT_STRUCT(buffer) *buf;
	MPT_STRUCT(config_item) *item;
	const char *name;
	size_t item_count;
	int len;
	
	name = path->base + path->off;
	if (!(buf = arr->_buf) || (len = mpt_path_next(path)) < 0) {
		return 0;
	}
	if (buf->_content_traits != mpt_config_item_traits()) {
		return 0;
	}
	item_count = buf->_size / sizeof(*item);
	item = (MPT_STRUCT(config_item) *) (buf + 1);
	while (item_count--) {
		if (item->identifier._len == 0
		 || mpt_identifier_compare(&item->identifier, name, len) != 0) {
			++item;
			continue;
		}
		if (path->len) {
			return mpt_config_item_query(&item->elements, path);
		}
		return item;
	}
	return 0;
}